

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<fmt::v5::basic_string_view<wchar_t>>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,void,void,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                *matchers,
               tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
               *values,ostream *os)

{
  basic_string_view<wchar_t> x;
  bool bVar1;
  StringMatchResultListener *this;
  ostream *poVar2;
  ostream *in_RDX;
  tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
  *in_RSI;
  tuple<testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
  *in_RDI;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  StringMatchResultListener *in_stack_fffffffffffffda8;
  StringMatchResultListener *in_stack_fffffffffffffdb0;
  MatchResultListener *in_stack_fffffffffffffdb8;
  MatcherBase<fmt::v5::basic_string_view<wchar_t>_> *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  string local_228 [32];
  _func_int **local_208;
  ostream *poStack_200;
  _func_int **local_48;
  ostream *poStack_40;
  ostream *local_18;
  
  local_18 = in_RDX;
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<fmt::v5::basic_string_view<wchar_t>>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,void,void,void,void,void,void,void,void,void>>
            (in_RDI,in_RSI,in_RDX);
  std::tr1::
  get<0,testing::Matcher<fmt::v5::basic_string_view<wchar_t>>,void,void,void,void,void,void,void,void,void>
            ((tuple<testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
              *)0x17ebc9);
  Matcher<fmt::v5::basic_string_view<wchar_t>_>::Matcher
            ((Matcher<fmt::v5::basic_string_view<wchar_t>_> *)in_stack_fffffffffffffdb0,
             (Matcher<fmt::v5::basic_string_view<wchar_t>_> *)in_stack_fffffffffffffda8);
  this = (StringMatchResultListener *)
         std::tr1::
         get<0,fmt::v5::basic_string_view<wchar_t>,void,void,void,void,void,void,void,void,void>
                   ((tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                     *)0x17ebe6);
  local_48 = (this->super_MatchResultListener)._vptr_MatchResultListener;
  poStack_40 = (this->super_MatchResultListener).stream_;
  StringMatchResultListener::StringMatchResultListener(this);
  local_208 = local_48;
  poStack_200 = poStack_40;
  x.data_._7_1_ = in_stack_fffffffffffffdcf;
  x.data_._0_7_ = in_stack_fffffffffffffdc8;
  x.size_ = (size_t)this;
  bVar1 = MatcherBase<fmt::v5::basic_string_view<wchar_t>_>::MatchAndExplain
                    (in_stack_fffffffffffffdc0,x,in_stack_fffffffffffffdb8);
  if (!bVar1) {
    poVar2 = std::operator<<(local_18,"  Expected arg #");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    std::operator<<(poVar2,": ");
    in_stack_fffffffffffffdb0 =
         (StringMatchResultListener *)
         std::tr1::
         get<0,testing::Matcher<fmt::v5::basic_string_view<wchar_t>>,void,void,void,void,void,void,void,void,void>
                   ((tuple<testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                     *)0x17ec96);
    MatcherBase<fmt::v5::basic_string_view<wchar_t>_>::DescribeTo
              ((MatcherBase<fmt::v5::basic_string_view<wchar_t>_> *)in_stack_fffffffffffffdb0,
               (ostream *)in_stack_fffffffffffffda8);
    std::operator<<(local_18,"\n           Actual: ");
    UniversalPrint<fmt::v5::basic_string_view<wchar_t>>
              ((basic_string_view<wchar_t> *)in_stack_fffffffffffffdb0,
               (ostream *)in_stack_fffffffffffffda8);
    StringMatchResultListener::str_abi_cxx11_(in_stack_fffffffffffffda8);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffdb0,(ostream *)in_stack_fffffffffffffda8);
    std::__cxx11::string::~string(local_228);
    std::operator<<(local_18,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffdb0);
  Matcher<fmt::v5::basic_string_view<wchar_t>_>::~Matcher
            ((Matcher<fmt::v5::basic_string_view<wchar_t>_> *)0x17ed88);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }